

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Call(w3Interp *this)

{
  size_type sVar1;
  reference pvVar2;
  ulong __n;
  w3Function *function;
  size_t function_index;
  w3Interp *this_local;
  
  __n = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  sVar1 = std::vector<w3Function,_std::allocator<w3Function>_>::size(&this->module->functions);
  if (sVar1 <= __n) {
    AssertFailed("function_index < module->functions.size ()");
  }
  pvVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                     (&this->module->functions,__n);
  pvVar2->function_index = __n;
  pvVar2 = std::vector<w3Function,_std::allocator<w3Function>_>::operator[]
                     (&this->module->functions,__n);
  Invoke(this,pvVar2);
  return;
}

Assistant:

INTERP (Call)
{
    // FIXME In the instruction table
    const size_t function_index = instr->u32;
    Assert (function_index < module->functions.size ());
    w3Function* function = &module->functions [function_index];
    function->function_index = function_index; // TODO remove this
    Invoke (module->functions [function_index]);
}